

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_rawget(lua_State *L,int idx)

{
  ushort uVar1;
  int iVar2;
  GCObject *pGVar3;
  lua_CFunction p_Var4;
  Value VVar5;
  int *piVar6;
  TValue *pTVar7;
  StkId pTVar8;
  LuaType LVar9;
  char *__assertion;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x2cb,"int lua_rawget(lua_State *, int)");
  }
  pTVar7 = index2addr(L,idx);
  uVar1 = pTVar7->tt_;
  if ((uVar1 & 0xf) != 5) {
    __assert_fail("((((((((t))->tt_)) & 0x0F)) == (5))) && \"table expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x2cd,"int lua_rawget(lua_State *, int)");
  }
  if (uVar1 == 0x8025) {
    p_Var4 = (pTVar7->value_).f;
    if ((p_Var4[8] != (_func_int_lua_State_ptr)0x15) && (p_Var4[8] != (_func_int_lua_State_ptr)0x25)
       ) {
      __assert_fail("((((t)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t)->value_).gc)->tt == ((5) | ((2) << 4)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x2d3,"int lua_rawget(lua_State *, int)");
    }
    pTVar8 = L->top;
    if (pTVar8[-1].tt_ != 0x13) {
      __assert_fail("(((((key))->tt_) == (((3) | ((1) << 4))))) && \"key must be integer\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x2d5,"int lua_rawget(lua_State *, int)");
    }
    VVar5 = pTVar8[-1].value_;
    if ((long)(ulong)(*(uint *)(p_Var4 + 0xc) - 1) < (long)VVar5) {
LAB_0010e945:
      LVar9 = 0;
    }
    else {
      if (*(uint *)(p_Var4 + 0xc) <= (uint)VVar5.b) {
LAB_0010ea47:
        luaG_runerror(L,"array out of bounds");
      }
      LVar9 = 3;
      pTVar8[-1].value_ = *(Value *)(*(long *)(p_Var4 + 0x30) + (VVar5.i & 0xffffffffU) * 8);
    }
  }
  else {
    if (uVar1 != 0x8015) {
      if (uVar1 != 0x8005) {
        __assertion = 
        "(((((t))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((t))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
        ;
LAB_0010ea5f:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x2e2,"int lua_rawget(lua_State *, int)");
      }
      if (((Table *)(pTVar7->value_).gc)->tt != '\x05') {
        __assert_fail("(((t)->value_).gc)->tt == 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x2cf,"int lua_rawget(lua_State *, int)");
      }
      pTVar8 = L->top;
      pTVar7 = luaH_get((Table *)(pTVar7->value_).gc,pTVar8 + -1);
      pGVar3 = (pTVar7->value_).gc;
      pTVar8[-1].value_.gc = pGVar3;
      uVar1 = pTVar7->tt_;
      pTVar8[-1].tt_ = uVar1;
      if (((short)uVar1 < 0) &&
         (((uVar1 & 0x7f) != (ushort)pGVar3->tt ||
          ((pGVar3->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x2d0,"int lua_rawget(lua_State *, int)");
      }
      goto LAB_0010e969;
    }
    p_Var4 = (pTVar7->value_).f;
    if ((p_Var4[8] != (_func_int_lua_State_ptr)0x15) && (p_Var4[8] != (_func_int_lua_State_ptr)0x25)
       ) {
      __assertion = 
      "((((t)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t)->value_).gc)->tt == ((5) | ((2) << 4)))"
      ;
      goto LAB_0010ea5f;
    }
    pTVar8 = L->top;
    if (pTVar8[-1].tt_ != 0x13) {
      __assert_fail("(((((key))->tt_) == (((3) | ((1) << 4))))) && \"key must be integer\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x2e4,"int lua_rawget(lua_State *, int)");
    }
    VVar5 = pTVar8[-1].value_;
    if ((long)(ulong)(*(uint *)(p_Var4 + 0xc) - 1) < VVar5.i) goto LAB_0010e945;
    if (*(uint *)(p_Var4 + 0xc) <= (uint)VVar5.b) goto LAB_0010ea47;
    pTVar8[-1].value_ = *(Value *)(*(long *)(p_Var4 + 0x30) + (VVar5.i & 0xffffffffU) * 8);
    LVar9 = 0x13;
  }
  pTVar8[-1].tt_ = LVar9;
LAB_0010e969:
  piVar6 = *(int **)&L[-1].hookmask;
  *piVar6 = *piVar6 + -1;
  if (*piVar6 == 0) {
    return L->top[-1].tt_ & 0xf;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x2f0,"int lua_rawget(lua_State *, int)");
}

Assistant:

LUA_API int lua_rawget(lua_State *L, int idx) {
  StkId t;
  lua_lock(L);
  t = index2addr(L, idx);
  api_check(L, ttistable(t), "table expected");
  if (ttisLtable(t)) {
      Table* h = hvalue(t);
      setobj2s(L, L->top - 1, luaH_get(h, L->top - 1));
  }
  else if (ttisfarray(t)) {
    RaviArray* h = arrvalue(t);
    TValue *key = L->top - 1;
    api_check(L, ttisinteger(key), "key must be integer");
    if (ttisinteger(key)) {
      lua_Integer n = ivalue(key);
      if (n <= raviH_getn(h)) { raviH_get_float_inline(L, h, n, key); }
      else {
        setnilvalue(key);
      }
    }
    else {
      setnilvalue(key);
    }
  }
  else {
    RaviArray* h = arrvalue(t);
    TValue *key = L->top - 1;
    api_check(L, ttisinteger(key), "key must be integer");
    if (ttisinteger(key)) {
      lua_Integer n = ivalue(key);
      if (n <= raviH_getn(h)) { raviH_get_int_inline(L, h, n, key); }
      else {
        setnilvalue(key);
      }
    }
    else {
      setnilvalue(key);
    }
  }
  lua_unlock(L);
  return ttnov(L->top - 1);
}